

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer_impl.h
# Opt level: O0

QWeakPointer<QObject> * __thiscall
QWeakPointer<QObject>::operator=(QWeakPointer<QObject> *this,QWeakPointer<QObject> *other)

{
  QWeakPointer<QObject> *in_RDI;
  long in_FS_OFFSET;
  QWeakPointer<QObject> copy;
  QWeakPointer<QObject> *this_00;
  QWeakPointer<QObject> local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_18.value = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = &local_18;
  QWeakPointer(this_00,in_RDI);
  swap(this_00,in_RDI);
  ~QWeakPointer(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QWeakPointer &operator=(const QWeakPointer &other) noexcept
    {
        QWeakPointer copy(other);
        swap(copy);
        return *this;
    }